

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_auto_choose_color
               (LodePNGColorMode *mode_out,uchar *image,uint w,uint h,LodePNGColorMode *mode_in)

{
  uint uVar1;
  LodePNGColorType local_47c;
  bool local_475;
  uint local_474;
  uint local_470;
  uint mask;
  uchar *p;
  uint palette_ok;
  uint palettebits;
  uint n;
  uint i;
  uint error;
  LodePNGColorProfile prof;
  LodePNGColorMode *mode_in_local;
  uint h_local;
  uint w_local;
  uchar *image_local;
  LodePNGColorMode *mode_out_local;
  
  prof._1044_8_ = mode_in;
  lodepng_color_profile_init((LodePNGColorProfile *)&i);
  n = lodepng_get_color_profile
                ((LodePNGColorProfile *)&i,image,w,h,(LodePNGColorMode *)prof._1044_8_);
  mode_out_local._4_4_ = n;
  if (n == 0) {
    mode_out->key_defined = 0;
    if ((error != 0) && (w * h < 0x11)) {
      prof.key_r = 1;
      prof.key_g = 0;
      error = 0;
      if ((uint)prof.palette._1016_4_ < 8) {
        prof.palette[0x3f8] = '\b';
        prof.palette[0x3f9] = '\0';
        prof.palette[0x3fa] = '\0';
        prof.palette[0x3fb] = '\0';
      }
    }
    if ((uint)prof._12_4_ < 3) {
      local_470 = 1;
    }
    else {
      if ((uint)prof._12_4_ < 5) {
        local_474 = 2;
      }
      else {
        local_474 = 8;
        if ((uint)prof._12_4_ < 0x11) {
          local_474 = 4;
        }
      }
      local_470 = local_474;
    }
    local_475 = (uint)prof._12_4_ < 0x101 && (uint)prof.palette._1016_4_ < 9;
    if (w * h < (uint)(prof._12_4_ << 1)) {
      local_475 = false;
    }
    if ((i == 0) && ((uint)prof.palette._1016_4_ <= local_470)) {
      local_475 = false;
    }
    if (local_475) {
      lodepng_palette_clear(mode_out);
      palettebits = 0;
      while ((palettebits != prof._12_4_ &&
             (n = lodepng_palette_add(mode_out,prof.palette[(ulong)(palettebits << 2) - 8],
                                      prof.palette[(ulong)(palettebits * 4 + 1) - 8],
                                      prof.palette[(ulong)(palettebits * 4 + 2) - 8],
                                      prof.palette[(ulong)(palettebits * 4 + 3) - 8]), n == 0))) {
        palettebits = palettebits + 1;
      }
      mode_out->colortype = LCT_PALETTE;
      mode_out->bitdepth = local_470;
      if (((*(int *)prof._1044_8_ == 3) &&
          (mode_out->palettesize <= *(ulong *)(prof._1044_8_ + 0x10))) &&
         (*(uint *)(prof._1044_8_ + 4) == mode_out->bitdepth)) {
        lodepng_color_mode_cleanup(mode_out);
        lodepng_color_mode_copy(mode_out,(LodePNGColorMode *)prof._1044_8_);
      }
    }
    else {
      mode_out->bitdepth = prof.palette._1016_4_;
      if (prof._8_4_ == 0) {
        local_47c = LCT_GREY;
        if (i != 0) {
          local_47c = LCT_RGB;
        }
      }
      else {
        local_47c = LCT_GREY_ALPHA;
        if (i != 0) {
          local_47c = LCT_RGBA;
        }
      }
      mode_out->colortype = local_47c;
      if (error != 0) {
        uVar1 = (1 << ((byte)mode_out->bitdepth & 0x1f)) - 1;
        mode_out->key_r = (ushort)prof.colored & uVar1;
        mode_out->key_g = prof.colored._2_2_ & uVar1;
        mode_out->key_b = (ushort)prof.key & uVar1;
        mode_out->key_defined = 1;
      }
    }
    mode_out_local._4_4_ = n;
  }
  return mode_out_local._4_4_;
}

Assistant:

unsigned lodepng_auto_choose_color(LodePNGColorMode* mode_out,
                                   const unsigned char* image, unsigned w, unsigned h,
                                   const LodePNGColorMode* mode_in)
{
  LodePNGColorProfile prof;
  unsigned error = 0;
  unsigned i, n, palettebits, palette_ok;

  lodepng_color_profile_init(&prof);
  error = lodepng_get_color_profile(&prof, image, w, h, mode_in);
  if(error) return error;
  mode_out->key_defined = 0;

  if(prof.key && w * h <= 16)
  {
    prof.alpha = 1; /*too few pixels to justify tRNS chunk overhead*/
    prof.key = 0;
    if(prof.bits < 8) prof.bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
  }
  n = prof.numcolors;
  palettebits = n <= 2 ? 1 : (n <= 4 ? 2 : (n <= 16 ? 4 : 8));
  palette_ok = n <= 256 && prof.bits <= 8;
  if(w * h < n * 2) palette_ok = 0; /*don't add palette overhead if image has only a few pixels*/
  if(!prof.colored && prof.bits <= palettebits) palette_ok = 0; /*grey is less overhead*/

  if(palette_ok)
  {
    unsigned char* p = prof.palette;
    lodepng_palette_clear(mode_out); /*remove potential earlier palette*/
    for(i = 0; i != prof.numcolors; ++i)
    {
      error = lodepng_palette_add(mode_out, p[i * 4 + 0], p[i * 4 + 1], p[i * 4 + 2], p[i * 4 + 3]);
      if(error) break;
    }

    mode_out->colortype = LCT_PALETTE;
    mode_out->bitdepth = palettebits;

    if(mode_in->colortype == LCT_PALETTE && mode_in->palettesize >= mode_out->palettesize
        && mode_in->bitdepth == mode_out->bitdepth)
    {
      /*If input should have same palette colors, keep original to preserve its order and prevent conversion*/
      lodepng_color_mode_cleanup(mode_out);
      lodepng_color_mode_copy(mode_out, mode_in);
    }
  }
  else /*8-bit or 16-bit per channel*/
  {
    mode_out->bitdepth = prof.bits;
    mode_out->colortype = prof.alpha ? (prof.colored ? LCT_RGBA : LCT_GREY_ALPHA)
                                     : (prof.colored ? LCT_RGB : LCT_GREY);

    if(prof.key)
    {
      unsigned mask = (1u << mode_out->bitdepth) - 1u; /*profile always uses 16-bit, mask converts it*/
      mode_out->key_r = prof.key_r & mask;
      mode_out->key_g = prof.key_g & mask;
      mode_out->key_b = prof.key_b & mask;
      mode_out->key_defined = 1;
    }
  }

  return error;
}